

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void mg_sock_get_addr(sock_t sock,int remote,socket_address *sa)

{
  socklen_t slen;
  socklen_t local_4;
  
  *(undefined8 *)sa = 0;
  ((char *)((long)sa + 2))[6] = '\0';
  ((char *)((long)sa + 2))[7] = '\0';
  ((char *)((long)sa + 2))[8] = '\0';
  ((char *)((long)sa + 2))[9] = '\0';
  ((char *)((long)sa + 2))[10] = '\0';
  ((char *)((long)sa + 2))[0xb] = '\0';
  ((char *)((long)sa + 2))[0xc] = '\0';
  ((char *)((long)sa + 2))[0xd] = '\0';
  if (remote == 0) {
    getsockname(sock,(sockaddr *)&sa->sa,&local_4);
  }
  else {
    getpeername(sock,(sockaddr *)&sa->sa,&local_4);
  }
  return;
}

Assistant:

static void mg_sock_get_addr(sock_t sock, int remote,
                             union socket_address *sa) {
#ifndef MG_CC3200
    socklen_t slen = sizeof(sa);
    memset(sa, 0, sizeof(*sa));
    if (remote) {
        getpeername(sock, &sa->sa, &slen);
    } else {
        getsockname(sock, &sa->sa, &slen);
    }
#else
    memset(sa, 0, sizeof(*sa));
#endif
}